

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_ustar.c
# Opt level: O3

void test_write_format_tar_ustar(void)

{
  char *pcVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  undefined1 auVar24 [13];
  undefined1 auVar25 [15];
  undefined1 auVar26 [11];
  undefined1 auVar27 [13];
  undefined1 auVar28 [15];
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  int iVar36;
  long lVar37;
  undefined4 *buff;
  archive *_a;
  archive_entry *paVar38;
  la_ssize_t lVar39;
  wchar_t wVar40;
  wchar_t wVar41;
  char cVar61;
  ushort uVar42;
  char cVar62;
  char cVar65;
  ushort uVar63;
  ushort uVar64;
  undefined4 uVar44;
  char cVar66;
  char cVar69;
  ushort uVar67;
  ushort uVar68;
  char cVar70;
  char cVar73;
  ushort uVar71;
  ushort uVar72;
  byte bVar74;
  ushort uVar75;
  ushort uVar76;
  byte bVar78;
  ushort uVar79;
  ushort uVar80;
  byte bVar82;
  ushort uVar83;
  ushort uVar84;
  byte bVar86;
  ushort uVar87;
  ushort uVar88;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar57 [16];
  short sVar43;
  byte bVar77;
  byte bVar81;
  byte bVar85;
  byte bVar89;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [12];
  undefined1 auVar94 [16];
  int iVar115;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [12];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar140 [16];
  byte bVar141;
  undefined1 auVar142 [12];
  ushort uVar157;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  long lVar158;
  long lVar159;
  long lVar160;
  long lVar162;
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  ushort uVar175;
  byte bVar186;
  ushort uVar185;
  undefined1 auVar176 [12];
  ushort uVar181;
  ushort uVar182;
  ushort uVar183;
  ushort uVar184;
  byte bVar187;
  byte bVar189;
  ushort uVar188;
  byte bVar190;
  undefined1 auVar178 [16];
  byte bVar194;
  ushort uVar191;
  ushort uVar192;
  ushort uVar193;
  undefined1 auVar180 [16];
  char acStack_237 [7];
  size_t used;
  char f99 [100];
  char acStack_1c4 [12];
  char f100 [101];
  char f256 [257];
  undefined6 uVar45;
  undefined8 uVar46;
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar53 [16];
  undefined1 auVar49 [14];
  undefined1 auVar54 [16];
  undefined1 auVar50 [14];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  long lVar91;
  undefined1 auVar93 [14];
  undefined1 auVar114 [16];
  undefined1 auVar136 [16];
  undefined1 auVar117 [14];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar133 [16];
  undefined1 auVar139 [16];
  undefined1 auVar147 [16];
  undefined1 auVar143 [14];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar144 [16];
  undefined1 auVar150 [16];
  undefined1 auVar177 [14];
  undefined1 auVar179 [16];
  
  lVar160 = 0xe;
  lVar162 = 0xf;
  lVar37 = 0xf;
  auVar96 = _DAT_002bb290;
  auVar163 = _DAT_002c3260;
  auVar164 = _DAT_002c3270;
  auVar165 = _DAT_002c3280;
  auVar167 = _DAT_002c3290;
  auVar169 = _DAT_002c32a0;
  auVar171 = _DAT_00291130;
  auVar173 = _DAT_00291140;
  do {
    auVar94 = auVar173 ^ _DAT_00291150;
    iVar36 = auVar94._0_4_;
    iVar115 = auVar94._8_4_;
    auVar118._4_4_ = iVar36;
    auVar118._0_4_ = iVar36;
    auVar118._8_4_ = iVar115;
    auVar118._12_4_ = iVar115;
    auVar178._0_4_ = -(uint)(iVar36 < -0x7fffff9d);
    auVar178._4_4_ = -(uint)(iVar36 < -0x7fffff9d);
    auVar178._8_4_ = -(uint)(iVar115 < -0x7fffff9d);
    auVar178._12_4_ = -(uint)(iVar115 < -0x7fffff9d);
    auVar95._0_4_ = -(uint)(auVar94._4_4_ == -0x80000000);
    auVar95._4_4_ = -(uint)(auVar94._4_4_ == -0x80000000);
    auVar95._8_4_ = -(uint)(auVar94._12_4_ == -0x80000000);
    auVar95._12_4_ = -(uint)(auVar94._12_4_ == -0x80000000);
    auVar95 = auVar95 & auVar178;
    auVar94 = pshuflw(auVar118,auVar95,0xe8);
    auVar118 = packssdw(auVar94,auVar94);
    bVar86 = auVar96[8];
    bVar89 = auVar96[9];
    bVar141 = auVar96[10];
    bVar186 = auVar96[0xb];
    bVar187 = auVar96[0xc];
    bVar189 = auVar96[0xd];
    bVar190 = auVar96[0xe];
    bVar194 = auVar96[0xf];
    uVar175 = (ushort)((ushort)bVar86 * 0x4f) >> 8;
    uVar181 = (ushort)((ushort)bVar89 * 0x4f) >> 8;
    uVar182 = (ushort)((ushort)bVar141 * 0x4f) >> 8;
    uVar183 = (ushort)((ushort)bVar186 * 0x4f) >> 8;
    uVar184 = (ushort)((ushort)bVar187 * 0x4f) >> 8;
    uVar185 = (ushort)((ushort)bVar189 * 0x4f) >> 8;
    uVar188 = (ushort)((ushort)bVar190 * 0x4f) >> 8;
    uVar191 = (ushort)((ushort)bVar194 * 0x4f) >> 8;
    cVar73 = auVar96[7];
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar96._0_13_;
    auVar3[0xe] = cVar73;
    cVar70 = auVar96[6];
    auVar6[0xc] = cVar70;
    auVar6._0_12_ = auVar96._0_12_;
    auVar6._13_2_ = auVar3._13_2_;
    auVar9[0xb] = 0;
    auVar9._0_11_ = auVar96._0_11_;
    auVar9._12_3_ = auVar6._12_3_;
    cVar69 = auVar96[5];
    auVar12[10] = cVar69;
    auVar12._0_10_ = auVar96._0_10_;
    auVar12._11_4_ = auVar9._11_4_;
    auVar15[9] = 0;
    auVar15._0_9_ = auVar96._0_9_;
    auVar15._10_5_ = auVar12._10_5_;
    cVar66 = auVar96[4];
    auVar18[8] = cVar66;
    auVar18._0_8_ = auVar96._0_8_;
    auVar18._9_6_ = auVar15._9_6_;
    auVar21._7_8_ = 0;
    auVar21._0_7_ = auVar18._8_7_;
    cVar65 = auVar96[3];
    Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),cVar65);
    auVar30._9_6_ = 0;
    auVar30._0_9_ = Var22;
    cVar62 = auVar96[2];
    auVar23._1_10_ = SUB1510(auVar30 << 0x30,5);
    auVar23[0] = cVar62;
    auVar31._11_4_ = 0;
    auVar31._0_11_ = auVar23;
    cVar61 = auVar96[1];
    auVar24._1_12_ = SUB1512(auVar31 << 0x20,3);
    auVar24[0] = cVar61;
    bVar74 = auVar96[0];
    uVar63 = auVar24._0_2_ * 0x4f;
    uVar67 = auVar23._0_2_ * 0x4f;
    uVar71 = (short)Var22 * 0x4f;
    uVar75 = auVar18._8_2_ * 0x4f;
    uVar79 = auVar12._10_2_ * 0x4f;
    uVar83 = auVar6._12_2_ * 0x4f;
    uVar87 = (auVar3._13_2_ >> 8) * 0x4f;
    uVar42 = (ushort)((ushort)bVar74 * 0x4f) >> 8;
    uVar64 = uVar63 >> 8;
    uVar68 = uVar67 >> 8;
    uVar72 = uVar71 >> 8;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar42 = CONCAT11((uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64),
                      (uVar42 != 0) * (uVar42 < 0x100) *
                      (char)((ushort)((ushort)bVar74 * 0x4f) >> 8) - (0xff < uVar42));
    uVar44 = CONCAT13((uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72),
                      CONCAT12((uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) -
                               (0xff < uVar68),uVar42));
    uVar45 = CONCAT15((uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80),
                      CONCAT14((uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) -
                               (0xff < uVar76),uVar44));
    uVar46 = CONCAT17((uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88),
                      CONCAT16((uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) -
                               (0xff < uVar84),uVar45));
    auVar47._0_10_ =
         CONCAT19((uVar181 != 0) * (uVar181 < 0x100) * (char)((ushort)((ushort)bVar89 * 0x4f) >> 8)
                  - (0xff < uVar181),
                  CONCAT18((uVar175 != 0) * (uVar175 < 0x100) *
                           (char)((ushort)((ushort)bVar86 * 0x4f) >> 8) - (0xff < uVar175),uVar46));
    auVar47[10] = (uVar182 != 0) * (uVar182 < 0x100) * (char)((ushort)((ushort)bVar141 * 0x4f) >> 8)
                  - (0xff < uVar182);
    auVar47[0xb] = (uVar183 != 0) * (uVar183 < 0x100) *
                   (char)((ushort)((ushort)bVar186 * 0x4f) >> 8) - (0xff < uVar183);
    auVar49[0xc] = (uVar184 != 0) * (uVar184 < 0x100) *
                   (char)((ushort)((ushort)bVar187 * 0x4f) >> 8) - (0xff < uVar184);
    auVar49._0_12_ = auVar47;
    auVar49[0xd] = (uVar185 != 0) * (uVar185 < 0x100) *
                   (char)((ushort)((ushort)bVar189 * 0x4f) >> 8) - (0xff < uVar185);
    auVar94[0xe] = (uVar188 != 0) * (uVar188 < 0x100) *
                   (char)((ushort)((ushort)bVar190 * 0x4f) >> 8) - (0xff < uVar188);
    auVar94._0_14_ = auVar49;
    auVar94[0xf] = (uVar191 != 0) * (uVar191 < 0x100) *
                   (char)((ushort)((ushort)bVar194 * 0x4f) >> 8) - (0xff < uVar191);
    auVar51._0_2_ = uVar42 >> 3;
    auVar51._2_2_ = (ushort)((uint)uVar44 >> 0x13);
    auVar51._4_2_ = (ushort)((uint6)uVar45 >> 0x23);
    auVar51._6_2_ = (ushort)((ulong)uVar46 >> 0x33);
    auVar51._8_2_ = (ushort)((unkuint10)auVar47._0_10_ >> 0x43);
    auVar51._10_2_ = auVar47._10_2_ >> 3;
    auVar51._12_2_ = auVar49._12_2_ >> 3;
    auVar51._14_2_ = auVar94._14_2_ >> 3;
    auVar51 = auVar51 & _DAT_002c53d0;
    sVar43 = CONCAT11(auVar51[8],auVar51[8]);
    uVar44 = CONCAT13(auVar51[9],CONCAT12(auVar51[9],sVar43));
    uVar45 = CONCAT15(auVar51[10],CONCAT14(auVar51[10],uVar44));
    uVar46 = CONCAT17(auVar51[0xb],CONCAT16(auVar51[0xb],uVar45));
    auVar176._0_10_ = CONCAT19(auVar51[0xc],CONCAT18(auVar51[0xc],uVar46));
    auVar176[10] = auVar51[0xd];
    auVar176[0xb] = auVar51[0xd];
    auVar177[0xc] = auVar51[0xe];
    auVar177._0_12_ = auVar176;
    auVar177[0xd] = auVar51[0xe];
    auVar179[0xf] = auVar51[0xf];
    auVar179[0xe] = auVar179[0xf];
    auVar179._0_14_ = auVar177;
    uVar80 = sVar43 * 0x1a;
    uVar84 = (short)((uint)uVar44 >> 0x10) * 0x1a;
    uVar88 = (short)((uint6)uVar45 >> 0x20) * 0x1a;
    uVar181 = (short)((ulong)uVar46 >> 0x30) * 0x1a;
    uVar183 = (short)((unkuint10)auVar176._0_10_ >> 0x40) * 0x1a;
    uVar185 = auVar176._10_2_ * 0x1a;
    uVar191 = auVar177._12_2_ * 0x1a;
    uVar192 = auVar179._14_2_ * 0x1a;
    uVar83 = uVar80 & 0xff;
    uVar87 = uVar84 & 0xff;
    uVar175 = uVar88 & 0xff;
    uVar182 = uVar181 & 0xff;
    uVar184 = uVar183 & 0xff;
    uVar188 = uVar185 & 0xff;
    uVar157 = uVar191 & 0xff;
    uVar193 = uVar192 & 0xff;
    auVar56._0_14_ = auVar51._0_14_;
    auVar56[0xe] = auVar51[7];
    auVar56[0xf] = auVar51[7];
    auVar55._14_2_ = auVar56._14_2_;
    auVar55._0_13_ = auVar51._0_13_;
    auVar55[0xd] = auVar51[6];
    auVar54._13_3_ = auVar55._13_3_;
    auVar54._0_12_ = auVar51._0_12_;
    auVar54[0xc] = auVar51[6];
    auVar53._12_4_ = auVar54._12_4_;
    auVar53._0_11_ = auVar51._0_11_;
    auVar53[0xb] = auVar51[5];
    auVar52._11_5_ = auVar53._11_5_;
    auVar52._0_10_ = auVar51._0_10_;
    auVar52[10] = auVar51[5];
    bVar77 = auVar51[0] * '\x1a';
    bVar78 = auVar51[1] * '\x1a';
    bVar81 = auVar51[2] * '\x1a';
    bVar82 = auVar51[3] * '\x1a';
    bVar85 = auVar51[4] * '\x1a';
    uVar71 = auVar52._10_2_ * 0x1a;
    uVar75 = auVar54._12_2_ * 0x1a;
    uVar42 = (ushort)bVar77;
    uVar63 = (ushort)bVar78;
    uVar64 = (ushort)bVar81;
    uVar67 = (ushort)bVar82;
    uVar68 = (ushort)bVar85;
    uVar72 = uVar71 & 0xff;
    uVar76 = uVar75 & 0xff;
    uVar79 = auVar55._14_2_ * 0x1a & 0xff;
    if ((auVar118 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      acStack_237[lVar37] =
           (bVar74 - ((uVar42 != 0) * (uVar42 < 0x100) * bVar77 - (0xff < uVar42))) + 'a';
    }
    auVar96 = packssdw(auVar95,auVar95);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._0_4_ >> 8 & 1) != 0) {
      acStack_237[lVar37 + 1] =
           (cVar61 - ((uVar63 != 0) * (uVar63 < 0x100) * bVar78 - (0xff < uVar63))) + 'a';
    }
    auVar96 = auVar171 ^ _DAT_00291150;
    auVar119._0_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar119._4_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar119._8_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar119._12_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar97._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar97._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar97._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar97._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar96 = packssdw(auVar96,auVar97 & auVar119);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    auVar57._8_8_ = lVar162;
    auVar57._0_8_ = lVar160;
    if ((auVar96._0_4_ >> 0x10 & 1) != 0) {
      acStack_237[lVar37 + 2] =
           (cVar62 - ((uVar64 != 0) * (uVar64 < 0x100) * bVar81 - (0xff < uVar64))) + 'a';
    }
    auVar96 = pshufhw(auVar96,auVar97 & auVar119,0x84);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._0_4_ >> 0x18 & 1) != 0) {
      acStack_237[lVar37 + 3] =
           (cVar65 - ((uVar67 != 0) * (uVar67 < 0x100) * bVar82 - (0xff < uVar67))) + 'a';
    }
    auVar96 = auVar169 ^ _DAT_00291150;
    auVar120._0_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar120._4_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar120._8_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar120._12_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar98._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar98._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar98._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar98._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar98 = auVar98 & auVar120;
    auVar96 = pshuflw(auVar96,auVar98,0xe8);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      acStack_237[lVar37 + 4] =
           (cVar66 - ((uVar68 != 0) * (uVar68 < 0x100) * bVar85 - (0xff < uVar68))) + 'a';
    }
    auVar94 = packssdw(auVar98,auVar98);
    auVar96 = packssdw(auVar96,auVar94);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._4_2_ >> 8 & 1) != 0) {
      acStack_237[lVar37 + 5] =
           (cVar69 - ((uVar72 != 0) * (uVar72 < 0x100) * (char)uVar71 - (0xff < uVar72))) + 'a';
    }
    auVar96 = auVar167 ^ _DAT_00291150;
    auVar121._0_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar121._4_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar121._8_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar121._12_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar99._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar99._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar99._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar99._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar96 = packssdw(auVar96,auVar99 & auVar121);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      acStack_237[lVar37 + 6] =
           (cVar70 - ((uVar76 != 0) * (uVar76 < 0x100) * (char)uVar75 - (0xff < uVar76))) + 'a';
    }
    auVar96 = pshufhw(auVar96,auVar99 & auVar121,0x84);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._6_2_ >> 8 & 1) != 0) {
      f99[lVar37 + -8] =
           (cVar73 - ((uVar79 != 0) * (uVar79 < 0x100) * (char)(auVar55._14_2_ * 0x1a) -
                     (0xff < uVar79))) + 'a';
    }
    auVar96 = auVar165 ^ _DAT_00291150;
    auVar122._0_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar122._4_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar122._8_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar122._12_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar100._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar100._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar100._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar100._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar100 = auVar100 & auVar122;
    auVar96 = pshuflw(auVar96,auVar100,0xe8);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      f99[lVar37 + -7] =
           (bVar86 - ((uVar83 != 0) * (uVar83 < 0x100) * (char)uVar80 - (0xff < uVar83))) + 'a';
    }
    auVar94 = packssdw(auVar100,auVar100);
    auVar94 = packssdw(auVar94,auVar94);
    auVar96 = packsswb(auVar96,auVar94);
    if ((auVar96._8_2_ >> 8 & 1) != 0) {
      f99[lVar37 + -6] =
           (bVar89 - ((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar84 - (0xff < uVar87))) + 'a';
    }
    auVar96 = auVar164 ^ _DAT_00291150;
    auVar123._0_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar123._4_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar123._8_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar123._12_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar101._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar101._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar101._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar101._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar96 = packssdw(auVar96,auVar101 & auVar123);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      f99[lVar37 + -5] =
           (bVar141 - ((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar88 - (0xff < uVar175))) + 'a';
    }
    auVar96 = pshufhw(auVar96,auVar101 & auVar123,0x84);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._10_2_ >> 8 & 1) != 0) {
      f99[lVar37 + -4] =
           (bVar186 - ((uVar182 != 0) * (uVar182 < 0x100) * (char)uVar181 - (0xff < uVar182))) + 'a'
      ;
    }
    auVar96 = auVar163 ^ _DAT_00291150;
    auVar124._0_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar124._4_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9d);
    auVar124._8_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar124._12_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9d);
    auVar102._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar102._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar102._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar102._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar102 = auVar102 & auVar124;
    auVar96 = pshuflw(auVar96,auVar102,0xe8);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      f99[lVar37 + -3] =
           (bVar187 - ((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar183 - (0xff < uVar184))) + 'a'
      ;
    }
    auVar94 = packssdw(auVar102,auVar102);
    auVar96 = packssdw(auVar96,auVar94);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._12_2_ >> 8 & 1) != 0) {
      f99[lVar37 + -2] =
           (bVar189 - ((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar185 - (0xff < uVar188))) + 'a'
      ;
    }
    auVar57 = auVar57 ^ _DAT_00291150;
    auVar125._0_4_ = -(uint)(auVar57._0_4_ < -0x7fffff9d);
    auVar125._4_4_ = -(uint)(auVar57._0_4_ < -0x7fffff9d);
    auVar125._8_4_ = -(uint)(auVar57._8_4_ < -0x7fffff9d);
    auVar125._12_4_ = -(uint)(auVar57._8_4_ < -0x7fffff9d);
    auVar103._0_4_ = -(uint)(auVar57._4_4_ == -0x80000000);
    auVar103._4_4_ = -(uint)(auVar57._4_4_ == -0x80000000);
    auVar103._8_4_ = -(uint)(auVar57._12_4_ == -0x80000000);
    auVar103._12_4_ = -(uint)(auVar57._12_4_ == -0x80000000);
    auVar96 = packssdw(auVar57,auVar103 & auVar125);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      f99[lVar37 + -1] =
           (bVar190 - ((uVar157 != 0) * (uVar157 < 0x100) * (char)uVar191 - (0xff < uVar157))) + 'a'
      ;
    }
    auVar96 = pshufhw(auVar96,auVar103 & auVar125,0x84);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._14_2_ >> 8 & 1) != 0) {
      f99[lVar37] = (bVar194 -
                    ((uVar193 != 0) * (uVar193 < 0x100) * (char)uVar192 - (0xff < uVar193))) + 'a';
    }
    lVar158 = auVar173._8_8_;
    auVar173._0_8_ = auVar173._0_8_ + 0x10;
    auVar173._8_8_ = lVar158 + 0x10;
    lVar158 = auVar171._8_8_;
    auVar171._0_8_ = auVar171._0_8_ + 0x10;
    auVar171._8_8_ = lVar158 + 0x10;
    lVar158 = auVar169._8_8_;
    auVar169._0_8_ = auVar169._0_8_ + 0x10;
    auVar169._8_8_ = lVar158 + 0x10;
    lVar158 = auVar167._8_8_;
    auVar167._0_8_ = auVar167._0_8_ + 0x10;
    auVar167._8_8_ = lVar158 + 0x10;
    lVar158 = auVar165._8_8_;
    auVar165._0_8_ = auVar165._0_8_ + 0x10;
    auVar165._8_8_ = lVar158 + 0x10;
    lVar158 = auVar164._8_8_;
    auVar164._0_8_ = auVar164._0_8_ + 0x10;
    auVar164._8_8_ = lVar158 + 0x10;
    lVar158 = auVar163._8_8_;
    auVar163._0_8_ = auVar163._0_8_ + 0x10;
    auVar163._8_8_ = lVar158 + 0x10;
    lVar160 = lVar160 + 0x10;
    lVar162 = lVar162 + 0x10;
    auVar96[0] = bVar74 + 0x10;
    auVar96[1] = cVar61 + '\x10';
    auVar96[2] = cVar62 + '\x10';
    auVar96[3] = cVar65 + '\x10';
    auVar96[4] = cVar66 + '\x10';
    auVar96[5] = cVar69 + '\x10';
    auVar96[6] = cVar70 + '\x10';
    auVar96[7] = cVar73 + '\x10';
    auVar96[8] = bVar86 + 0x10;
    auVar96[9] = bVar89 + 0x10;
    auVar96[10] = bVar141 + 0x10;
    auVar96[0xb] = bVar186 + 0x10;
    auVar96[0xc] = bVar187 + 0x10;
    auVar96[0xd] = bVar189 + 0x10;
    auVar96[0xe] = bVar190 + 0x10;
    auVar96[0xf] = bVar194 + 0x10;
    lVar37 = lVar37 + 0x10;
  } while (lVar37 != 0x7f);
  f99[99] = '\0';
  lVar160 = 0xe;
  lVar162 = 0xf;
  lVar158 = 0xc;
  lVar159 = 0xd;
  lVar37 = 0xf;
  auVar90 = _DAT_002c3290;
  auVar140 = _DAT_00291130;
  auVar166 = _DAT_002c3270;
  auVar168 = _DAT_002c3280;
  auVar170 = _DAT_002c32a0;
  auVar172 = _DAT_00291140;
  auVar174 = _DAT_002bb290;
  do {
    auVar96 = auVar172 ^ _DAT_00291150;
    auVar126._0_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9c);
    auVar126._4_4_ = -(uint)(auVar96._0_4_ < -0x7fffff9c);
    auVar126._8_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9c);
    auVar126._12_4_ = -(uint)(auVar96._8_4_ < -0x7fffff9c);
    auVar104._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar104._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar104._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar104._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar104 = auVar104 & auVar126;
    auVar96 = pshuflw(auVar126,auVar104,0xe8);
    auVar96 = packssdw(auVar96,auVar96);
    bVar74 = auVar174[8];
    bVar77 = auVar174[9];
    bVar78 = auVar174[10];
    bVar81 = auVar174[0xb];
    bVar82 = auVar174[0xc];
    bVar85 = auVar174[0xd];
    bVar86 = auVar174[0xe];
    bVar89 = auVar174[0xf];
    uVar42 = (ushort)((ushort)bVar74 * 0x4f) >> 8;
    uVar63 = (ushort)((ushort)bVar77 * 0x4f) >> 8;
    uVar64 = (ushort)((ushort)bVar78 * 0x4f) >> 8;
    uVar67 = (ushort)((ushort)bVar81 * 0x4f) >> 8;
    uVar68 = (ushort)((ushort)bVar82 * 0x4f) >> 8;
    uVar71 = (ushort)((ushort)bVar85 * 0x4f) >> 8;
    uVar72 = (ushort)((ushort)bVar86 * 0x4f) >> 8;
    uVar75 = (ushort)((ushort)bVar89 * 0x4f) >> 8;
    cVar73 = auVar174[7];
    auVar4[0xd] = 0;
    auVar4._0_13_ = auVar174._0_13_;
    auVar4[0xe] = cVar73;
    cVar70 = auVar174[6];
    auVar7[0xc] = cVar70;
    auVar7._0_12_ = auVar174._0_12_;
    auVar7._13_2_ = auVar4._13_2_;
    auVar10[0xb] = 0;
    auVar10._0_11_ = auVar174._0_11_;
    auVar10._12_3_ = auVar7._12_3_;
    cVar69 = auVar174[5];
    auVar13[10] = cVar69;
    auVar13._0_10_ = auVar174._0_10_;
    auVar13._11_4_ = auVar10._11_4_;
    auVar16[9] = 0;
    auVar16._0_9_ = auVar174._0_9_;
    auVar16._10_5_ = auVar13._10_5_;
    cVar66 = auVar174[4];
    auVar19[8] = cVar66;
    auVar19._0_8_ = auVar174._0_8_;
    auVar19._9_6_ = auVar16._9_6_;
    auVar25._7_8_ = 0;
    auVar25._0_7_ = auVar19._8_7_;
    cVar65 = auVar174[3];
    Var22 = CONCAT81(SUB158(auVar25 << 0x40,7),cVar65);
    auVar32._9_6_ = 0;
    auVar32._0_9_ = Var22;
    cVar62 = auVar174[2];
    auVar26._1_10_ = SUB1510(auVar32 << 0x30,5);
    auVar26[0] = cVar62;
    auVar33._11_4_ = 0;
    auVar33._0_11_ = auVar26;
    cVar61 = auVar174[1];
    auVar27._1_12_ = SUB1512(auVar33 << 0x20,3);
    auVar27[0] = cVar61;
    bVar141 = auVar174[0];
    uVar79 = auVar27._0_2_ * 0x4f;
    uVar83 = auVar26._0_2_ * 0x4f;
    uVar87 = (short)Var22 * 0x4f;
    uVar175 = auVar19._8_2_ * 0x4f;
    uVar182 = auVar13._10_2_ * 0x4f;
    uVar184 = auVar7._12_2_ * 0x4f;
    uVar188 = (auVar4._13_2_ >> 8) * 0x4f;
    uVar76 = (ushort)((ushort)bVar141 * 0x4f) >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar181 = uVar175 >> 8;
    uVar183 = uVar182 >> 8;
    uVar185 = uVar184 >> 8;
    uVar191 = uVar188 >> 8;
    uVar76 = CONCAT11((uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80),
                      (uVar76 != 0) * (uVar76 < 0x100) *
                      (char)((ushort)((ushort)bVar141 * 0x4f) >> 8) - (0xff < uVar76));
    uVar44 = CONCAT13((uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88),
                      CONCAT12((uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) -
                               (0xff < uVar84),uVar76));
    uVar45 = CONCAT15((uVar183 != 0) * (uVar183 < 0x100) * (char)(uVar182 >> 8) - (0xff < uVar183),
                      CONCAT14((uVar181 != 0) * (uVar181 < 0x100) * (char)(uVar175 >> 8) -
                               (0xff < uVar181),uVar44));
    uVar46 = CONCAT17((uVar191 != 0) * (uVar191 < 0x100) * (char)(uVar188 >> 8) - (0xff < uVar191),
                      CONCAT16((uVar185 != 0) * (uVar185 < 0x100) * (char)(uVar184 >> 8) -
                               (0xff < uVar185),uVar45));
    auVar142._0_10_ =
         CONCAT19((uVar63 != 0) * (uVar63 < 0x100) * (char)((ushort)((ushort)bVar77 * 0x4f) >> 8) -
                  (0xff < uVar63),
                  CONCAT18((uVar42 != 0) * (uVar42 < 0x100) *
                           (char)((ushort)((ushort)bVar74 * 0x4f) >> 8) - (0xff < uVar42),uVar46));
    auVar142[10] = (uVar64 != 0) * (uVar64 < 0x100) * (char)((ushort)((ushort)bVar78 * 0x4f) >> 8) -
                   (0xff < uVar64);
    auVar142[0xb] =
         (uVar67 != 0) * (uVar67 < 0x100) * (char)((ushort)((ushort)bVar81 * 0x4f) >> 8) -
         (0xff < uVar67);
    auVar143[0xc] =
         (uVar68 != 0) * (uVar68 < 0x100) * (char)((ushort)((ushort)bVar82 * 0x4f) >> 8) -
         (0xff < uVar68);
    auVar143._0_12_ = auVar142;
    auVar143[0xd] =
         (uVar71 != 0) * (uVar71 < 0x100) * (char)((ushort)((ushort)bVar85 * 0x4f) >> 8) -
         (0xff < uVar71);
    auVar144[0xe] =
         (uVar72 != 0) * (uVar72 < 0x100) * (char)((ushort)((ushort)bVar86 * 0x4f) >> 8) -
         (0xff < uVar72);
    auVar144._0_14_ = auVar143;
    auVar144[0xf] =
         (uVar75 != 0) * (uVar75 < 0x100) * (char)((ushort)((ushort)bVar89 * 0x4f) >> 8) -
         (0xff < uVar75);
    auVar145._0_2_ = uVar76 >> 3;
    auVar145._2_2_ = (ushort)((uint)uVar44 >> 0x13);
    auVar145._4_2_ = (ushort)((uint6)uVar45 >> 0x23);
    auVar145._6_2_ = (ushort)((ulong)uVar46 >> 0x33);
    auVar145._8_2_ = (ushort)((unkuint10)auVar142._0_10_ >> 0x43);
    auVar145._10_2_ = auVar142._10_2_ >> 3;
    auVar145._12_2_ = auVar143._12_2_ >> 3;
    auVar145._14_2_ = auVar144._14_2_ >> 3;
    auVar145 = auVar145 & _DAT_002c53d0;
    sVar43 = CONCAT11(auVar145[8],auVar145[8]);
    uVar44 = CONCAT13(auVar145[9],CONCAT12(auVar145[9],sVar43));
    uVar45 = CONCAT15(auVar145[10],CONCAT14(auVar145[10],uVar44));
    uVar46 = CONCAT17(auVar145[0xb],CONCAT16(auVar145[0xb],uVar45));
    auVar48._0_10_ = CONCAT19(auVar145[0xc],CONCAT18(auVar145[0xc],uVar46));
    auVar48[10] = auVar145[0xd];
    auVar48[0xb] = auVar145[0xd];
    auVar50[0xc] = auVar145[0xe];
    auVar50._0_12_ = auVar48;
    auVar50[0xd] = auVar145[0xe];
    auVar58[0xf] = auVar145[0xf];
    auVar58[0xe] = auVar58[0xf];
    auVar58._0_14_ = auVar50;
    uVar42 = sVar43 * 0x1a;
    uVar64 = (short)((uint)uVar44 >> 0x10) * 0x1a;
    uVar68 = (short)((uint6)uVar45 >> 0x20) * 0x1a;
    uVar72 = (short)((ulong)uVar46 >> 0x30) * 0x1a;
    uVar76 = (short)((unkuint10)auVar48._0_10_ >> 0x40) * 0x1a;
    uVar80 = auVar48._10_2_ * 0x1a;
    uVar84 = auVar50._12_2_ * 0x1a;
    uVar88 = auVar58._14_2_ * 0x1a;
    uVar63 = uVar42 & 0xff;
    uVar67 = uVar64 & 0xff;
    uVar71 = uVar68 & 0xff;
    uVar75 = uVar72 & 0xff;
    uVar79 = uVar76 & 0xff;
    uVar83 = uVar80 & 0xff;
    uVar87 = uVar84 & 0xff;
    uVar175 = uVar88 & 0xff;
    auVar150._0_14_ = auVar145._0_14_;
    auVar150[0xe] = auVar145[7];
    auVar150[0xf] = auVar145[7];
    auVar149._14_2_ = auVar150._14_2_;
    auVar149._0_13_ = auVar145._0_13_;
    auVar149[0xd] = auVar145[6];
    auVar148._13_3_ = auVar149._13_3_;
    auVar148._0_12_ = auVar145._0_12_;
    auVar148[0xc] = auVar145[6];
    auVar147._12_4_ = auVar148._12_4_;
    auVar147._0_11_ = auVar145._0_11_;
    auVar147[0xb] = auVar145[5];
    auVar146._11_5_ = auVar147._11_5_;
    auVar146._0_10_ = auVar145._0_10_;
    auVar146[10] = auVar145[5];
    bVar186 = auVar145[0] * '\x1a';
    bVar187 = auVar145[1] * '\x1a';
    bVar189 = auVar145[2] * '\x1a';
    bVar190 = auVar145[3] * '\x1a';
    bVar194 = auVar145[4] * '\x1a';
    uVar188 = auVar146._10_2_ * 0x1a;
    uVar157 = auVar148._12_2_ * 0x1a;
    uVar181 = (ushort)bVar186;
    uVar182 = (ushort)bVar187;
    uVar183 = (ushort)bVar189;
    uVar184 = (ushort)bVar190;
    uVar185 = (ushort)bVar194;
    uVar191 = uVar188 & 0xff;
    uVar192 = uVar157 & 0xff;
    uVar193 = auVar149._14_2_ * 0x1a & 0xff;
    auVar59[0] = (bVar141 - ((uVar181 != 0) * (uVar181 < 0x100) * bVar186 - (0xff < uVar181))) + 'A'
    ;
    auVar59[1] = (cVar61 - ((uVar182 != 0) * (uVar182 < 0x100) * bVar187 - (0xff < uVar182))) + 'A';
    auVar59[2] = (cVar62 - ((uVar183 != 0) * (uVar183 < 0x100) * bVar189 - (0xff < uVar183))) + 'A';
    auVar59[3] = (cVar65 - ((uVar184 != 0) * (uVar184 < 0x100) * bVar190 - (0xff < uVar184))) + 'A';
    auVar59[4] = (cVar66 - ((uVar185 != 0) * (uVar185 < 0x100) * bVar194 - (0xff < uVar185))) + 'A';
    auVar59[5] = (cVar69 - ((uVar191 != 0) * (uVar191 < 0x100) * (char)uVar188 - (0xff < uVar191)))
                 + 'A';
    auVar59[6] = (cVar70 - ((uVar192 != 0) * (uVar192 < 0x100) * (char)uVar157 - (0xff < uVar192)))
                 + 'A';
    auVar59[7] = (cVar73 - ((uVar193 != 0) * (uVar193 < 0x100) * (char)(auVar149._14_2_ * 0x1a) -
                           (0xff < uVar193))) + 'A';
    auVar59[8] = (bVar74 - ((uVar63 != 0) * (uVar63 < 0x100) * (char)uVar42 - (0xff < uVar63))) +
                 'A';
    auVar59[9] = (bVar77 - ((uVar67 != 0) * (uVar67 < 0x100) * (char)uVar64 - (0xff < uVar67))) +
                 'A';
    auVar59[10] = (bVar78 - ((uVar71 != 0) * (uVar71 < 0x100) * (char)uVar68 - (0xff < uVar71))) +
                  'A';
    auVar59[0xb] = (bVar81 - ((uVar75 != 0) * (uVar75 < 0x100) * (char)uVar72 - (0xff < uVar75))) +
                   'A';
    auVar59[0xc] = (bVar82 - ((uVar79 != 0) * (uVar79 < 0x100) * (char)uVar76 - (0xff < uVar79))) +
                   'A';
    auVar59[0xd] = (bVar85 - ((uVar83 != 0) * (uVar83 < 0x100) * (char)uVar80 - (0xff < uVar83))) +
                   'A';
    auVar59[0xe] = (bVar86 - ((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar84 - (0xff < uVar87))) +
                   'A';
    auVar59[0xf] = (bVar89 - ((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar88 - (0xff < uVar175)))
                   + 'A';
    if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      f99[lVar37 + 0x61] = auVar59[0];
    }
    auVar96 = packssdw(auVar104,auVar104);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._0_4_ >> 8 & 1) != 0) {
      f99[lVar37 + 0x62] = auVar59[1];
    }
    auVar96 = auVar140 ^ _DAT_00291150;
    iVar36 = auVar96._0_4_;
    iVar115 = auVar96._8_4_;
    auVar127._4_4_ = iVar36;
    auVar127._0_4_ = iVar36;
    auVar127._8_4_ = iVar115;
    auVar127._12_4_ = iVar115;
    auVar151._0_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar151._4_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar151._8_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar151._12_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar105._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar105._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar105._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar105._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar105 = auVar105 & auVar151;
    auVar96 = packssdw(auVar127,auVar105);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    auVar110._8_8_ = lVar159;
    auVar110._0_8_ = lVar158;
    if ((auVar96._0_4_ >> 0x10 & 1) != 0) {
      f99[lVar37 + 99] = auVar59[2];
    }
    auVar96 = pshufhw(auVar105,auVar105,0x84);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._0_4_ >> 0x18 & 1) != 0) {
      acStack_1c4[lVar37] = auVar59[3];
    }
    auVar96 = auVar170 ^ _DAT_00291150;
    iVar36 = auVar96._0_4_;
    iVar115 = auVar96._8_4_;
    auVar128._4_4_ = iVar36;
    auVar128._0_4_ = iVar36;
    auVar128._8_4_ = iVar115;
    auVar128._12_4_ = iVar115;
    auVar152._0_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar152._4_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar152._8_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar152._12_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar106._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar106._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar106._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar106._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar106 = auVar106 & auVar152;
    auVar96 = pshuflw(auVar128,auVar106,0xe8);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      acStack_1c4[lVar37 + 1] = auVar59[4];
    }
    auVar96 = packssdw(auVar106,auVar106);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._4_2_ >> 8 & 1) != 0) {
      acStack_1c4[lVar37 + 2] = auVar59[5];
    }
    auVar96 = auVar90 ^ _DAT_00291150;
    iVar36 = auVar96._0_4_;
    iVar115 = auVar96._8_4_;
    auVar129._4_4_ = iVar36;
    auVar129._0_4_ = iVar36;
    auVar129._8_4_ = iVar115;
    auVar129._12_4_ = iVar115;
    auVar153._0_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar153._4_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar153._8_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar153._12_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar107._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar107._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar107._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar107._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar107 = auVar107 & auVar153;
    auVar96 = packssdw(auVar129,auVar107);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      acStack_1c4[lVar37 + 3] = auVar59[6];
    }
    auVar96 = pshufhw(auVar107,auVar107,0x84);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._6_2_ >> 8 & 1) != 0) {
      acStack_1c4[lVar37 + 4] = auVar59[7];
    }
    auVar96 = auVar168 ^ _DAT_00291150;
    iVar36 = auVar96._0_4_;
    iVar115 = auVar96._8_4_;
    auVar130._4_4_ = iVar36;
    auVar130._0_4_ = iVar36;
    auVar130._8_4_ = iVar115;
    auVar130._12_4_ = iVar115;
    auVar154._0_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar154._4_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar154._8_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar154._12_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar108._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar108._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar108._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar108._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar108 = auVar108 & auVar154;
    auVar96 = pshuflw(auVar130,auVar108,0xe8);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      acStack_1c4[lVar37 + 5] = auVar59[8];
    }
    auVar96 = packssdw(auVar108,auVar108);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._8_2_ >> 8 & 1) != 0) {
      acStack_1c4[lVar37 + 6] = auVar59[9];
    }
    auVar96 = auVar166 ^ _DAT_00291150;
    iVar36 = auVar96._0_4_;
    iVar115 = auVar96._8_4_;
    auVar131._4_4_ = iVar36;
    auVar131._0_4_ = iVar36;
    auVar131._8_4_ = iVar115;
    auVar131._12_4_ = iVar115;
    auVar155._0_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar155._4_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar155._8_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar155._12_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar109._0_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar109._4_4_ = -(uint)(auVar96._4_4_ == -0x80000000);
    auVar109._8_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar109._12_4_ = -(uint)(auVar96._12_4_ == -0x80000000);
    auVar109 = auVar109 & auVar155;
    auVar96 = packssdw(auVar131,auVar109);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      acStack_1c4[lVar37 + 7] = auVar59[10];
    }
    auVar96 = pshufhw(auVar109,auVar109,0x84);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._10_2_ >> 8 & 1) != 0) {
      acStack_1c4[lVar37 + 8] = auVar59[0xb];
    }
    auVar110 = auVar110 ^ _DAT_00291150;
    iVar36 = auVar110._0_4_;
    iVar115 = auVar110._8_4_;
    auVar132._4_4_ = iVar36;
    auVar132._0_4_ = iVar36;
    auVar132._8_4_ = iVar115;
    auVar132._12_4_ = iVar115;
    auVar156._0_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar156._4_4_ = -(uint)(iVar36 < -0x7fffff9c);
    auVar156._8_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar156._12_4_ = -(uint)(iVar115 < -0x7fffff9c);
    auVar111._0_4_ = -(uint)(auVar110._4_4_ == -0x80000000);
    auVar111._4_4_ = -(uint)(auVar110._4_4_ == -0x80000000);
    auVar111._8_4_ = -(uint)(auVar110._12_4_ == -0x80000000);
    auVar111._12_4_ = -(uint)(auVar110._12_4_ == -0x80000000);
    auVar111 = auVar111 & auVar156;
    auVar96 = pshuflw(auVar132,auVar111,0xe8);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      acStack_1c4[lVar37 + 9] = auVar59[0xc];
    }
    auVar96 = packssdw(auVar111,auVar111);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    auVar112._8_8_ = lVar162;
    auVar112._0_8_ = lVar160;
    if ((auVar96._12_2_ >> 8 & 1) != 0) {
      acStack_1c4[lVar37 + 10] = auVar59[0xd];
    }
    auVar112 = auVar112 ^ _DAT_00291150;
    auVar113._4_4_ = auVar112._4_4_;
    auVar113._12_4_ = auVar112._12_4_;
    auVar161._0_4_ = -(uint)(auVar112._0_4_ < -0x7fffff9c);
    auVar161._4_4_ = -(uint)(auVar112._0_4_ < -0x7fffff9c);
    auVar161._8_4_ = -(uint)(auVar112._8_4_ < -0x7fffff9c);
    auVar161._12_4_ = -(uint)(auVar112._8_4_ < -0x7fffff9c);
    auVar113._0_4_ = auVar113._4_4_;
    auVar113._8_4_ = auVar113._12_4_;
    auVar180._0_4_ = -(uint)(auVar113._4_4_ == -0x80000000);
    auVar180._4_4_ = -(uint)(auVar113._4_4_ == -0x80000000);
    auVar180._8_4_ = -(uint)(auVar113._12_4_ == -0x80000000);
    auVar180._12_4_ = -(uint)(auVar113._12_4_ == -0x80000000);
    auVar96 = packssdw(auVar113,auVar180 & auVar161);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      acStack_1c4[lVar37 + 0xb] = auVar59[0xe];
    }
    auVar96 = pshufhw(auVar59,auVar180 & auVar161,0x84);
    auVar96 = packssdw(auVar96,auVar96);
    auVar96 = packsswb(auVar96,auVar96);
    if ((auVar96._14_2_ >> 8 & 1) != 0) {
      f100[lVar37] = auVar59[0xf];
    }
    lVar91 = auVar172._8_8_;
    auVar172._0_8_ = auVar172._0_8_ + 0x10;
    auVar172._8_8_ = lVar91 + 0x10;
    lVar91 = auVar140._8_8_;
    auVar140._0_8_ = auVar140._0_8_ + 0x10;
    auVar140._8_8_ = lVar91 + 0x10;
    lVar91 = auVar170._8_8_;
    auVar170._0_8_ = auVar170._0_8_ + 0x10;
    auVar170._8_8_ = lVar91 + 0x10;
    lVar91 = auVar90._8_8_;
    auVar90._0_8_ = auVar90._0_8_ + 0x10;
    auVar90._8_8_ = lVar91 + 0x10;
    lVar91 = auVar168._8_8_;
    auVar168._0_8_ = auVar168._0_8_ + 0x10;
    auVar168._8_8_ = lVar91 + 0x10;
    lVar91 = auVar166._8_8_;
    auVar166._0_8_ = auVar166._0_8_ + 0x10;
    auVar166._8_8_ = lVar91 + 0x10;
    lVar158 = lVar158 + 0x10;
    lVar159 = lVar159 + 0x10;
    lVar160 = lVar160 + 0x10;
    lVar162 = lVar162 + 0x10;
    auVar174[0] = bVar141 + 0x10;
    auVar174[1] = cVar61 + '\x10';
    auVar174[2] = cVar62 + '\x10';
    auVar174[3] = cVar65 + '\x10';
    auVar174[4] = cVar66 + '\x10';
    auVar174[5] = cVar69 + '\x10';
    auVar174[6] = cVar70 + '\x10';
    auVar174[7] = cVar73 + '\x10';
    auVar174[8] = bVar74 + 0x10;
    auVar174[9] = bVar77 + 0x10;
    auVar174[10] = bVar78 + 0x10;
    auVar174[0xb] = bVar81 + 0x10;
    auVar174[0xc] = bVar82 + 0x10;
    auVar174[0xd] = bVar85 + 0x10;
    auVar174[0xe] = bVar86 + 0x10;
    auVar174[0xf] = bVar89 + 0x10;
    lVar37 = lVar37 + 0x10;
  } while (lVar37 != 0x7f);
  f100[100] = '\0';
  lVar37 = 0;
  auVar60 = _DAT_002bb290;
  do {
    bVar74 = auVar60[8];
    bVar77 = auVar60[9];
    bVar78 = auVar60[10];
    bVar81 = auVar60[0xb];
    bVar82 = auVar60[0xc];
    bVar85 = auVar60[0xd];
    bVar86 = auVar60[0xe];
    bVar89 = auVar60[0xf];
    uVar42 = (ushort)((ushort)bVar74 * 0x4f) >> 8;
    uVar63 = (ushort)((ushort)bVar77 * 0x4f) >> 8;
    uVar64 = (ushort)((ushort)bVar78 * 0x4f) >> 8;
    uVar67 = (ushort)((ushort)bVar81 * 0x4f) >> 8;
    uVar68 = (ushort)((ushort)bVar82 * 0x4f) >> 8;
    uVar71 = (ushort)((ushort)bVar85 * 0x4f) >> 8;
    uVar72 = (ushort)((ushort)bVar86 * 0x4f) >> 8;
    uVar75 = (ushort)((ushort)bVar89 * 0x4f) >> 8;
    cVar73 = auVar60[7];
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar60._0_13_;
    auVar2[0xe] = cVar73;
    cVar70 = auVar60[6];
    auVar5[0xc] = cVar70;
    auVar5._0_12_ = auVar60._0_12_;
    auVar5._13_2_ = auVar2._13_2_;
    auVar8[0xb] = 0;
    auVar8._0_11_ = auVar60._0_11_;
    auVar8._12_3_ = auVar5._12_3_;
    cVar69 = auVar60[5];
    auVar11[10] = cVar69;
    auVar11._0_10_ = auVar60._0_10_;
    auVar11._11_4_ = auVar8._11_4_;
    auVar14[9] = 0;
    auVar14._0_9_ = auVar60._0_9_;
    auVar14._10_5_ = auVar11._10_5_;
    cVar66 = auVar60[4];
    auVar17[8] = cVar66;
    auVar17._0_8_ = auVar60._0_8_;
    auVar17._9_6_ = auVar14._9_6_;
    auVar28._7_8_ = 0;
    auVar28._0_7_ = auVar17._8_7_;
    cVar65 = auVar60[3];
    Var22 = CONCAT81(SUB158(auVar28 << 0x40,7),cVar65);
    auVar34._9_6_ = 0;
    auVar34._0_9_ = Var22;
    cVar62 = auVar60[2];
    auVar29._1_10_ = SUB1510(auVar34 << 0x30,5);
    auVar29[0] = cVar62;
    auVar35._11_4_ = 0;
    auVar35._0_11_ = auVar29;
    cVar61 = auVar60[1];
    auVar20[2] = cVar61;
    auVar20._0_2_ = auVar60._0_2_;
    auVar20._3_12_ = SUB1512(auVar35 << 0x20,3);
    uVar76 = (auVar60._0_2_ & 0xff) * 0x4f;
    uVar80 = auVar20._2_2_ * 0x4f;
    uVar84 = auVar29._0_2_ * 0x4f;
    uVar88 = (short)Var22 * 0x4f;
    uVar181 = auVar17._8_2_ * 0x4f;
    uVar183 = auVar11._10_2_ * 0x4f;
    uVar185 = auVar5._12_2_ * 0x4f;
    uVar191 = (auVar2._13_2_ >> 8) * 0x4f;
    uVar79 = uVar76 >> 8;
    uVar83 = uVar80 >> 8;
    uVar87 = uVar84 >> 8;
    uVar175 = uVar88 >> 8;
    uVar182 = uVar181 >> 8;
    uVar184 = uVar183 >> 8;
    uVar188 = uVar185 >> 8;
    uVar157 = uVar191 >> 8;
    uVar76 = CONCAT11((uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar83),
                      (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar79));
    uVar44 = CONCAT13((uVar175 != 0) * (uVar175 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar175),
                      CONCAT12((uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar84 >> 8) -
                               (0xff < uVar87),uVar76));
    uVar45 = CONCAT15((uVar184 != 0) * (uVar184 < 0x100) * (char)(uVar183 >> 8) - (0xff < uVar184),
                      CONCAT14((uVar182 != 0) * (uVar182 < 0x100) * (char)(uVar181 >> 8) -
                               (0xff < uVar182),uVar44));
    uVar46 = CONCAT17((uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar191 >> 8) - (0xff < uVar157),
                      CONCAT16((uVar188 != 0) * (uVar188 < 0x100) * (char)(uVar185 >> 8) -
                               (0xff < uVar188),uVar45));
    auVar116._0_10_ =
         CONCAT19((uVar63 != 0) * (uVar63 < 0x100) * (char)((ushort)((ushort)bVar77 * 0x4f) >> 8) -
                  (0xff < uVar63),
                  CONCAT18((uVar42 != 0) * (uVar42 < 0x100) *
                           (char)((ushort)((ushort)bVar74 * 0x4f) >> 8) - (0xff < uVar42),uVar46));
    auVar116[10] = (uVar64 != 0) * (uVar64 < 0x100) * (char)((ushort)((ushort)bVar78 * 0x4f) >> 8) -
                   (0xff < uVar64);
    auVar116[0xb] =
         (uVar67 != 0) * (uVar67 < 0x100) * (char)((ushort)((ushort)bVar81 * 0x4f) >> 8) -
         (0xff < uVar67);
    auVar117[0xc] =
         (uVar68 != 0) * (uVar68 < 0x100) * (char)((ushort)((ushort)bVar82 * 0x4f) >> 8) -
         (0xff < uVar68);
    auVar117._0_12_ = auVar116;
    auVar117[0xd] =
         (uVar71 != 0) * (uVar71 < 0x100) * (char)((ushort)((ushort)bVar85 * 0x4f) >> 8) -
         (0xff < uVar71);
    auVar133[0xe] =
         (uVar72 != 0) * (uVar72 < 0x100) * (char)((ushort)((ushort)bVar86 * 0x4f) >> 8) -
         (0xff < uVar72);
    auVar133._0_14_ = auVar117;
    auVar133[0xf] =
         (uVar75 != 0) * (uVar75 < 0x100) * (char)((ushort)((ushort)bVar89 * 0x4f) >> 8) -
         (0xff < uVar75);
    auVar134._0_2_ = uVar76 >> 3;
    auVar134._2_2_ = (ushort)((uint)uVar44 >> 0x13);
    auVar134._4_2_ = (ushort)((uint6)uVar45 >> 0x23);
    auVar134._6_2_ = (ushort)((ulong)uVar46 >> 0x33);
    auVar134._8_2_ = (ushort)((unkuint10)auVar116._0_10_ >> 0x43);
    auVar134._10_2_ = auVar116._10_2_ >> 3;
    auVar134._12_2_ = auVar117._12_2_ >> 3;
    auVar134._14_2_ = auVar133._14_2_ >> 3;
    auVar134 = auVar134 & _DAT_002c53d0;
    sVar43 = CONCAT11(auVar134[8],auVar134[8]);
    uVar44 = CONCAT13(auVar134[9],CONCAT12(auVar134[9],sVar43));
    uVar45 = CONCAT15(auVar134[10],CONCAT14(auVar134[10],uVar44));
    uVar46 = CONCAT17(auVar134[0xb],CONCAT16(auVar134[0xb],uVar45));
    auVar92._0_10_ = CONCAT19(auVar134[0xc],CONCAT18(auVar134[0xc],uVar46));
    auVar92[10] = auVar134[0xd];
    auVar92[0xb] = auVar134[0xd];
    auVar93[0xc] = auVar134[0xe];
    auVar93._0_12_ = auVar92;
    auVar93[0xd] = auVar134[0xe];
    auVar114[0xf] = auVar134[0xf];
    auVar114[0xe] = auVar114[0xf];
    auVar114._0_14_ = auVar93;
    uVar42 = sVar43 * 0x1a;
    uVar64 = (short)((uint)uVar44 >> 0x10) * 0x1a;
    uVar68 = (short)((uint6)uVar45 >> 0x20) * 0x1a;
    uVar72 = (short)((ulong)uVar46 >> 0x30) * 0x1a;
    uVar76 = (short)((unkuint10)auVar92._0_10_ >> 0x40) * 0x1a;
    uVar80 = auVar92._10_2_ * 0x1a;
    uVar84 = auVar93._12_2_ * 0x1a;
    uVar88 = auVar114._14_2_ * 0x1a;
    uVar63 = uVar42 & 0xff;
    uVar67 = uVar64 & 0xff;
    uVar71 = uVar68 & 0xff;
    uVar75 = uVar72 & 0xff;
    uVar79 = uVar76 & 0xff;
    uVar83 = uVar80 & 0xff;
    uVar87 = uVar84 & 0xff;
    uVar175 = uVar88 & 0xff;
    auVar139._0_14_ = auVar134._0_14_;
    auVar139[0xe] = auVar134[7];
    auVar139[0xf] = auVar134[7];
    auVar138._14_2_ = auVar139._14_2_;
    auVar138._0_13_ = auVar134._0_13_;
    auVar138[0xd] = auVar134[6];
    auVar137._13_3_ = auVar138._13_3_;
    auVar137._0_12_ = auVar134._0_12_;
    auVar137[0xc] = auVar134[6];
    auVar136._12_4_ = auVar137._12_4_;
    auVar136._0_11_ = auVar134._0_11_;
    auVar136[0xb] = auVar134[5];
    auVar135._11_5_ = auVar136._11_5_;
    auVar135._0_10_ = auVar134._0_10_;
    auVar135[10] = auVar134[5];
    bVar141 = auVar134[0] * '\x1a';
    bVar186 = auVar134[1] * '\x1a';
    bVar187 = auVar134[2] * '\x1a';
    bVar189 = auVar134[3] * '\x1a';
    bVar190 = auVar134[4] * '\x1a';
    uVar188 = auVar135._10_2_ * 0x1a;
    uVar157 = auVar137._12_2_ * 0x1a;
    uVar181 = (ushort)bVar141;
    uVar182 = (ushort)bVar186;
    uVar183 = (ushort)bVar187;
    uVar184 = (ushort)bVar189;
    uVar185 = (ushort)bVar190;
    uVar191 = uVar188 & 0xff;
    uVar192 = uVar157 & 0xff;
    uVar193 = auVar138._14_2_ * 0x1a & 0xff;
    f256[lVar37] = (auVar60[0] - ((uVar181 != 0) * (uVar181 < 0x100) * bVar141 - (0xff < uVar181)))
                   + 'A';
    f256[lVar37 + 1] =
         (cVar61 - ((uVar182 != 0) * (uVar182 < 0x100) * bVar186 - (0xff < uVar182))) + 'A';
    f256[lVar37 + 2] =
         (cVar62 - ((uVar183 != 0) * (uVar183 < 0x100) * bVar187 - (0xff < uVar183))) + 'A';
    f256[lVar37 + 3] =
         (cVar65 - ((uVar184 != 0) * (uVar184 < 0x100) * bVar189 - (0xff < uVar184))) + 'A';
    f256[lVar37 + 4] =
         (cVar66 - ((uVar185 != 0) * (uVar185 < 0x100) * bVar190 - (0xff < uVar185))) + 'A';
    f256[lVar37 + 5] =
         (cVar69 - ((uVar191 != 0) * (uVar191 < 0x100) * (char)uVar188 - (0xff < uVar191))) + 'A';
    f256[lVar37 + 6] =
         (cVar70 - ((uVar192 != 0) * (uVar192 < 0x100) * (char)uVar157 - (0xff < uVar192))) + 'A';
    f256[lVar37 + 7] =
         (cVar73 - ((uVar193 != 0) * (uVar193 < 0x100) * (char)(auVar138._14_2_ * 0x1a) -
                   (0xff < uVar193))) + 'A';
    f256[lVar37 + 8] =
         (bVar74 - ((uVar63 != 0) * (uVar63 < 0x100) * (char)uVar42 - (0xff < uVar63))) + 'A';
    f256[lVar37 + 9] =
         (bVar77 - ((uVar67 != 0) * (uVar67 < 0x100) * (char)uVar64 - (0xff < uVar67))) + 'A';
    f256[lVar37 + 10] =
         (bVar78 - ((uVar71 != 0) * (uVar71 < 0x100) * (char)uVar68 - (0xff < uVar71))) + 'A';
    f256[lVar37 + 0xb] =
         (bVar81 - ((uVar75 != 0) * (uVar75 < 0x100) * (char)uVar72 - (0xff < uVar75))) + 'A';
    f256[lVar37 + 0xc] =
         (bVar82 - ((uVar79 != 0) * (uVar79 < 0x100) * (char)uVar76 - (0xff < uVar79))) + 'A';
    f256[lVar37 + 0xd] =
         (bVar85 - ((uVar83 != 0) * (uVar83 < 0x100) * (char)uVar80 - (0xff < uVar83))) + 'A';
    f256[lVar37 + 0xe] =
         (bVar86 - ((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar84 - (0xff < uVar87))) + 'A';
    f256[lVar37 + 0xf] =
         (bVar89 - ((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar88 - (0xff < uVar175))) + 'A';
    lVar37 = lVar37 + 0x10;
    auVar60[0] = auVar60[0] + '\x10';
    auVar60[1] = cVar61 + '\x10';
    auVar60[2] = cVar62 + '\x10';
    auVar60[3] = cVar65 + '\x10';
    auVar60[4] = cVar66 + '\x10';
    auVar60[5] = cVar69 + '\x10';
    auVar60[6] = cVar70 + '\x10';
    auVar60[7] = cVar73 + '\x10';
    auVar60[8] = bVar74 + 0x10;
    auVar60[9] = bVar77 + 0x10;
    auVar60[10] = bVar78 + 0x10;
    auVar60[0xb] = bVar81 + 0x10;
    auVar60[0xc] = bVar82 + 0x10;
    auVar60[0xd] = bVar85 + 0x10;
    auVar60[0xe] = bVar86 + 0x10;
    auVar60[0xf] = bVar89 + 0x10;
  } while (lVar37 != 0x100);
  f256[0x9b] = '/';
  wVar40 = L'\0';
  f256[0x100] = '\0';
  buff = (undefined4 *)malloc(100000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'M',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar36 = archive_write_set_format_ustar(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar36,"archive_write_set_format_ustar(a)",_a);
  iVar36 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Q',0,"ARCHIVE_OK",(long)iVar36,"archive_write_add_filter_none(a)",_a);
  iVar36 = archive_write_open_memory(_a,buff,100000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar36,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  paVar38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'[',(uint)(paVar38 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar38,1,10);
  archive_entry_set_pathname(paVar38,"file");
  archive_entry_set_mode(paVar38,0x81b4);
  archive_entry_set_size(paVar38,10);
  archive_entry_set_uid(paVar38,0x50);
  archive_entry_set_gid(paVar38,0x5a);
  archive_entry_set_dev(paVar38,0xc);
  archive_entry_set_ino(paVar38,0x59);
  archive_entry_set_nlink(paVar38,2);
  iVar36 = archive_write_header(_a,paVar38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar36,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar38);
  lVar39 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'h',10,"10",lVar39,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'k',(uint)(paVar38 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar38,1,10);
  archive_entry_set_pathname(paVar38,"linkfile");
  archive_entry_set_mode(paVar38,0x81b4);
  archive_entry_set_uid(paVar38,0x50);
  archive_entry_set_gid(paVar38,0x5a);
  archive_entry_set_dev(paVar38,0xc);
  archive_entry_set_ino(paVar38,0x59);
  archive_entry_set_nlink(paVar38,2);
  iVar36 = archive_write_header(_a,paVar38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'w',0,"ARCHIVE_OK",(long)iVar36,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar38);
  lVar39 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'z',0,"0",lVar39,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'}',(uint)(paVar38 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar38,2,0x14);
  archive_entry_set_pathname(paVar38,"dir");
  archive_entry_set_mode(paVar38,0x41fd);
  archive_entry_set_size(paVar38,10);
  archive_entry_set_nlink(paVar38,2);
  iVar36 = archive_write_header(_a,paVar38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x84',0,"ARCHIVE_OK",(long)iVar36,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar38);
  lVar39 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x87',0,"0",lVar39,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\x8a',(uint)(paVar38 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar38,3,0x1e);
  archive_entry_set_pathname(paVar38,"symlink");
  archive_entry_set_mode(paVar38,0x1b4);
  archive_entry_set_filetype(paVar38,0xa000);
  archive_entry_set_symlink(paVar38,"file");
  archive_entry_set_size(paVar38,0);
  archive_entry_set_uid(paVar38,0x58);
  archive_entry_set_gid(paVar38,0x62);
  archive_entry_set_dev(paVar38,0xc);
  archive_entry_set_ino(paVar38,0x5a);
  archive_entry_set_nlink(paVar38,1);
  iVar36 = archive_write_header(_a,paVar38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x97',0,"ARCHIVE_OK",(long)iVar36,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar38);
  lVar39 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'\x9a',0,"0",lVar39,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'\x9d',(uint)(paVar38 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar38,1,10);
  archive_entry_set_pathname(paVar38,f99);
  archive_entry_set_mode(paVar38,0x81b4);
  archive_entry_set_size(paVar38,0);
  archive_entry_set_uid(paVar38,0x52);
  archive_entry_set_gid(paVar38,0x5d);
  archive_entry_set_dev(paVar38,0x66);
  archive_entry_set_ino(paVar38,7);
  archive_entry_set_nlink(paVar38,1);
  iVar36 = archive_write_header(_a,paVar38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'¨',0,"ARCHIVE_OK",(long)iVar36,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar38);
  paVar38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'¬',(uint)(paVar38 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar38,1,10);
  archive_entry_set_pathname(paVar38,f100);
  archive_entry_set_mode(paVar38,0x81b4);
  archive_entry_set_size(paVar38,0);
  archive_entry_set_uid(paVar38,0x52);
  archive_entry_set_gid(paVar38,0x5d);
  archive_entry_set_dev(paVar38,0x66);
  archive_entry_set_ino(paVar38,7);
  archive_entry_set_nlink(paVar38,1);
  iVar36 = archive_write_header(_a,paVar38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'·',0,"ARCHIVE_OK",(long)iVar36,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar38);
  paVar38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'»',(uint)(paVar38 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar38,1,10);
  archive_entry_set_pathname(paVar38,f256);
  archive_entry_set_mode(paVar38,0x81b4);
  archive_entry_set_size(paVar38,0);
  archive_entry_set_uid(paVar38,0x52);
  archive_entry_set_gid(paVar38,0x5d);
  archive_entry_set_dev(paVar38,0x66);
  archive_entry_set_ino(paVar38,7);
  archive_entry_set_nlink(paVar38,1);
  iVar36 = archive_write_header(_a,paVar38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Æ',0,"ARCHIVE_OK",(long)iVar36,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar38);
  iVar36 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ê',0,"ARCHIVE_OK",(long)iVar36,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ò',buff,"e + 0","file","\"file\"",5,"5",(void *)0x0);
  *buff = 0;
  *(undefined1 *)(buff + 1) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ó',buff + 0x19,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ô',buff + 0x1b,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Õ',buff + 0x1d,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ö',buff + 0x1f,"e + 124","00000000012 ","\"00000000012 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x1f) = 0;
  buff[0x21] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'×',buff + 0x22,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x22) = 0;
  buff[0x24] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ø',buff + 0x25,"e + 148","010034","\"010034\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x25) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ù',buff + 0x27,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x27) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ú',(void *)((long)buff + 0x9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Û',(void *)((long)buff + 0x101),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x101) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ü',(void *)((long)buff + 0x109),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x109) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ý',(void *)((long)buff + 0x129),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x129) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Þ',(void *)((long)buff + 0x149),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x149) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ß',(void *)((long)buff + 0x151),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x151) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'à',(void *)((long)buff + 0x159),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x159) = 0;
  lVar37 = 0;
  do {
    if (*(char *)((long)buff + lVar37) != '\0') goto LAB_00201244;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0x200);
  wVar40 = L'\x01';
LAB_00201244:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'á',wVar40,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'â',buff + 0x80,"e + 512","1234567890","\"1234567890\"",10,"10",(void *)0x0
                     );
  *(undefined8 *)(buff + 0x80) = 0;
  *(undefined2 *)(buff + 0x82) = 0;
  lVar37 = 0x201;
  do {
    if (lVar37 == 0x400) {
      wVar40 = L'\x01';
      goto LAB_002012d5;
    }
    pcVar1 = (char *)((long)buff + lVar37);
    lVar37 = lVar37 + 1;
  } while (*pcVar1 == '\0');
  wVar40 = L'\0';
LAB_002012d5:
  wVar41 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ã',wVar40,"is_null(e + 512, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ç',buff + 0x100,"e + 0","linkfile","\"linkfile\"",9,"9",(void *)0x0);
  *(undefined8 *)(buff + 0x100) = 0;
  *(undefined1 *)(buff + 0x102) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'è',buff + 0x119,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x119) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'é',buff + 0x11b,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x11b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ê',buff + 0x11d,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x11d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ë',buff + 0x11f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x11f) = 0;
  buff[0x121] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ì',buff + 0x122,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x122) = 0;
  buff[0x124] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'í',buff + 0x125,"e + 148","010707","\"010707\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x125) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'î',buff + 0x127,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x127) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ï',(void *)((long)buff + 0x49d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x49d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ð',(void *)((long)buff + 0x501),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x501) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ñ',(void *)((long)buff + 0x509),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x509) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ò',(void *)((long)buff + 0x529),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x529) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ó',(void *)((long)buff + 0x549),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x549) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ô',(void *)((long)buff + 0x551),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x551) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'õ',(void *)((long)buff + 0x559),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x559) = 0;
  lVar37 = -0x200;
  do {
    if (*(char *)((long)buff + lVar37 + 0x600) != '\0') goto LAB_00201724;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0);
  wVar41 = L'\x01';
LAB_00201724:
  wVar40 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ö',wVar41,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ú',buff + 0x180,"e + 0","dir/","\"dir/\"",4,"4",(void *)0x0);
  buff[0x180] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'û',buff + 0x199,"e + 100","000775 ","\"000775 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x199) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ü',buff + 0x19b,"e + 108","000000 ","\"000000 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ý',buff + 0x19d,"e + 116","000000 ","\"000000 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x19d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'þ',buff + 0x19f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x19f) = 0;
  buff[0x1a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ÿ',buff + 0x1a2,"e + 136","00000000002 ","\"00000000002 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x1a2) = 0;
  buff[0x1a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ā',buff + 0x1a5,"e + 148","007747","\"007747\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x1a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ā',buff + 0x1a7,"e + 156","5","\"5\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x1a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ă',(void *)((long)buff + 0x69d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x69d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ă',(void *)((long)buff + 0x701),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x701) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ą',(void *)((long)buff + 0x709),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x709) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ą',(void *)((long)buff + 0x729),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x729) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ć',(void *)((long)buff + 0x749),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x749) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ć',(void *)((long)buff + 0x751),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x751) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĉ',(void *)((long)buff + 0x759),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x759) = 0;
  lVar37 = 0x600;
  do {
    if (*(char *)((long)buff + lVar37) != '\0') goto LAB_00201b79;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0x800);
  wVar40 = L'\x01';
LAB_00201b79:
  wVar41 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ĉ',wVar40,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'č',buff + 0x200,"e + 0","symlink","\"symlink\"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x200) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ď',buff + 0x219,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x219) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ď',buff + 0x21b,"e + 108","000130 ","\"000130 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x21b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Đ',buff + 0x21d,"e + 116","000142 ","\"000142 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x21d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'đ',buff + 0x21f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x21f) = 0;
  buff[0x221] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ē',buff + 0x222,"e + 136","00000000003 ","\"00000000003 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x222) = 0;
  buff[0x224] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ē',buff + 0x225,"e + 148","011446","\"011446\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x225) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĕ',buff + 0x227,"e + 156","2","\"2\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x227) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĕ',(void *)((long)buff + 0x89d),"e + 157","file","\"file\"",5,"5",
                      (void *)0x0);
  *(undefined4 *)((long)buff + 0x89d) = 0;
  *(undefined1 *)((long)buff + 0x8a1) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ė',(void *)((long)buff + 0x901),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0x901) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ė',(void *)((long)buff + 0x909),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x909) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ę',(void *)((long)buff + 0x929),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x929) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ę',(void *)((long)buff + 0x949),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x949) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ě',(void *)((long)buff + 0x951),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0x951) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ě',(void *)((long)buff + 0x959),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0x959) = 0;
  lVar37 = -0x200;
  do {
    if (*(char *)((long)buff + lVar37 + 0xa00) != '\0') goto LAB_00201fdc;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0);
  wVar41 = L'\x01';
LAB_00201fdc:
  wVar40 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'Ĝ',wVar41,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ġ',buff + 0x280,"e + 0",f99,"f99",100,"100",(void *)0x0);
  *(undefined1 (*) [16])(buff + 0x280) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x284) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x288) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x28c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x290) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x294) = (undefined1  [16])0x0;
  buff[0x298] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ġ',buff + 0x299,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x299) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ģ',buff + 0x29b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x29b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ģ',buff + 0x29d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x29d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĥ',buff + 0x29f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x29f) = 0;
  buff[0x2a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĥ',buff + 0x2a2,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x2a2) = 0;
  buff[0x2a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ħ',buff + 0x2a5,"e + 148","034242","\"034242\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x2a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ħ',buff + 0x2a7,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x2a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĩ',(void *)((long)buff + 0xa9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xa9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĩ',(void *)((long)buff + 0xb01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xb01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ī',(void *)((long)buff + 0xb09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ī',(void *)((long)buff + 0xb29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĭ',(void *)((long)buff + 0xb49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xb49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĭ',(void *)((long)buff + 0xb51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xb51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Į',(void *)((long)buff + 0xb59),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xb59) = 0;
  lVar37 = -0x200;
  do {
    if (*(char *)((long)buff + lVar37 + 0xc00) != '\0') goto LAB_00202459;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0);
  wVar40 = L'\x01';
LAB_00202459:
  wVar41 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'į',wVar40,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĳ',buff + 0x300,"e + 0",f100,"f100",100,"100",(void *)0x0);
  *(undefined1 (*) [16])(buff + 0x300) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x304) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x308) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x30c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x310) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x314) = (undefined1  [16])0x0;
  buff[0x318] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĵ',buff + 0x319,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x319) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĵ',buff + 0x31b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x31b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ķ',buff + 0x31d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x31d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ķ',buff + 799,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 799) = 0;
  buff[0x321] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĸ',buff + 0x322,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x322) = 0;
  buff[0x324] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ĺ',buff + 0x325,"e + 148","026230","\"026230\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x325) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ĺ',buff + 0x327,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x327) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ļ',(void *)((long)buff + 0xc9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xc9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ļ',(void *)((long)buff + 0xd01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xd01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ľ',(void *)((long)buff + 0xd09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ľ',(void *)((long)buff + 0xd29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŀ',(void *)((long)buff + 0xd49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xd49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŀ',(void *)((long)buff + 0xd51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xd51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ł',(void *)((long)buff + 0xd59),"e + 345","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xd59) = 0;
  lVar37 = -0x200;
  do {
    if (*(char *)((long)buff + lVar37 + 0xe00) != '\0') goto LAB_002028d9;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0);
  wVar41 = L'\x01';
LAB_002028d9:
  wVar40 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ł',wVar41,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ņ',buff + 0x380,"e + 0",f256 + 0x9c,"f256 + 156",100,"100",(void *)0x0);
  *(undefined1 (*) [16])(buff + 0x380) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 900) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x388) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x38c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x390) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(buff + 0x394) = (undefined1  [16])0x0;
  buff[0x398] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ň',buff + 0x399,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x399) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ň',buff + 0x39b,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x39b) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŉ',buff + 0x39d,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x39d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŋ',buff + 0x39f,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x39f) = 0;
  buff[0x3a1] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŋ',buff + 0x3a2,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  *(undefined8 *)(buff + 0x3a2) = 0;
  buff[0x3a4] = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ō',buff + 0x3a5,"e + 148","055570","\"055570\\0 \"",8,"8",(void *)0x0);
  *(undefined8 *)(buff + 0x3a5) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ō',buff + 0x3a7,"e + 156","0","\"0\"",1,"1",(void *)0x0);
  *(undefined1 *)(buff + 0x3a7) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŏ',(void *)((long)buff + 0xe9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xe9d) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ŏ',(void *)((long)buff + 0xf01),"e + 257","ustar","\"ustar\\000000\"",8,
                      "8",(void *)0x0);
  *(undefined8 *)((long)buff + 0xf01) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ő',(void *)((long)buff + 0xf09),"e + 265","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xf09) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'ő',(void *)((long)buff + 0xf29),"e + 297","","\"\"",1,"1",(void *)0x0);
  *(undefined1 *)((long)buff + 0xf29) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Œ',(void *)((long)buff + 0xf49),"e + 329","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xf49) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'œ',(void *)((long)buff + 0xf51),"e + 337","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  *(undefined8 *)((long)buff + 0xf51) = 0;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ŕ',(void *)((long)buff + 0xf59),"e + 345",f256,"f256",0x9b,"155",
                      (void *)0x0);
  memset((void *)((long)buff + 0xf59),0,0x9b);
  lVar37 = 0xe00;
  do {
    if (*(char *)((long)buff + lVar37) != '\0') goto LAB_00202d60;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0x1000);
  wVar40 = L'\x01';
LAB_00202d60:
  wVar41 = L'\0';
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ŕ',wVar40,"is_null(e + 0, 512)",(void *)0x0);
  lVar37 = -0x400;
  do {
    if (*(char *)((long)buff + lVar37 + 0x1400) != '\0') goto LAB_00202d9d;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0);
  wVar41 = L'\x01';
LAB_00202d9d:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                   ,L'ś',wVar41,"is_null(e, 1024)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_ustar.c"
                      ,L'Ş',(long)(int)used,"(int)used",0x1400,"e - buff",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_ustar)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e;
	size_t buffsize = 100000;
	size_t used;
	int i;
	char f99[100];
	char f100[101];
	char f256[257];

	for (i = 0; i < 99; ++i)
		f99[i] = 'a' + i % 26;
	f99[99] = '\0';

	for (i = 0; i < 100; ++i)
		f100[i] = 'A' + i % 26;
	f100[100] = '\0';

	for (i = 0; i < 256; ++i)
		f256[i] = 'A' + i % 26;
	f256[155] = '/';
	f256[256] = '\0';

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Hardlink to "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "linkfile");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	/* TODO: Put this back and fix the bug. */
	/* archive_entry_set_size(entry, 10); */
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "dir" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "symlink" pointing to "file" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "symlink");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_symlink(entry,"file");
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 88);
	archive_entry_set_gid(entry, 98);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 90);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to symlink should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* file with 99-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f99);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 100-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f100);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 256-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f256);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* "file" */
	myAssertEqualMem(e + 0, "file", 5); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000012 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010034\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	myAssertEqualMem(e + 512, "1234567890", 10);
	assert(is_null(e + 512, 512));
	e += 1024;

	/* hardlink to "file" */
	myAssertEqualMem(e + 0, "linkfile", 9); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "010707\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "dir" */
	myAssertEqualMem(e + 0, "dir/", 4); /* Filename */
	myAssertEqualMem(e + 100, "000775 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000000 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000000 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000002 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007747\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "5", 1); /* typeflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "symlink" pointing to "file" */
	myAssertEqualMem(e + 0, "symlink", 8); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000130 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000142 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000003 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "011446\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "2", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 99-char filename */
	myAssertEqualMem(e + 0, f99, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "034242\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 100-char filename */
	myAssertEqualMem(e + 0, f100, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "026230\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, "", 1); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 256-char filename */
	myAssertEqualMem(e + 0, f256 + 156, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "055570\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "0", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	myAssertEqualMem(e + 257, "ustar\000000", 8); /* signature/version */
	myAssertEqualMem(e + 265, "", 1); /* uname */
	myAssertEqualMem(e + 297, "", 1); /* gname */
	myAssertEqualMem(e + 329, "000000 ", 8); /* devmajor */
	myAssertEqualMem(e + 337, "000000 ", 8); /* devminor */
	myAssertEqualMem(e + 345, f256, 155); /* prefix */
	assert(is_null(e + 0, 512));
	e += 512;

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_null(e, 1024));
	e += 1024;

	assertEqualInt((int)used, e - buff);

	free(buff);
}